

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

PropertyDescriptor *
Js::JavascriptOperators::FillMissingPropertyDescriptorFields<true>
          (PropertyDescriptor *__return_storage_ptr__,PropertyDescriptor *descriptor,
          ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptLibrary *this;
  PropertyDescriptor *this_00;
  undefined1 local_52;
  undefined1 local_51;
  undefined8 local_50;
  undefined8 local_48;
  PropertyDescriptor *defaultDescriptor;
  ScriptContext *scriptContext_local;
  PropertyDescriptor *descriptor_local;
  PropertyDescriptor *newDescriptor;
  
  PropertyDescriptor::PropertyDescriptor(__return_storage_ptr__);
  this = ScriptContext::GetLibrary(scriptContext);
  this_00 = JavascriptLibrary::GetDefaultPropertyDescriptor(this);
  bVar1 = PropertyDescriptor::GetterSpecified(descriptor);
  if (bVar1) {
    local_48 = PropertyDescriptor::GetGetter(descriptor);
  }
  else {
    local_48 = PropertyDescriptor::GetGetter(this_00);
  }
  PropertyDescriptor::SetGetter(__return_storage_ptr__,local_48);
  bVar1 = PropertyDescriptor::SetterSpecified(descriptor);
  if (bVar1) {
    local_50 = PropertyDescriptor::GetSetter(descriptor);
  }
  else {
    local_50 = PropertyDescriptor::GetSetter(this_00);
  }
  PropertyDescriptor::SetSetter(__return_storage_ptr__,local_50);
  bVar1 = PropertyDescriptor::ConfigurableSpecified(descriptor);
  if (bVar1) {
    local_51 = PropertyDescriptor::IsConfigurable(descriptor);
  }
  else {
    local_51 = PropertyDescriptor::IsConfigurable(this_00);
  }
  PropertyDescriptor::SetConfigurable(__return_storage_ptr__,local_51);
  bVar1 = PropertyDescriptor::EnumerableSpecified(descriptor);
  if (bVar1) {
    local_52 = PropertyDescriptor::IsEnumerable(descriptor);
  }
  else {
    local_52 = PropertyDescriptor::IsEnumerable(this_00);
  }
  PropertyDescriptor::SetEnumerable(__return_storage_ptr__,local_52);
  return __return_storage_ptr__;
}

Assistant:

PropertyDescriptor JavascriptOperators::FillMissingPropertyDescriptorFields(PropertyDescriptor descriptor, ScriptContext* scriptContext)
    {
        PropertyDescriptor newDescriptor;
        const PropertyDescriptor* defaultDescriptor = scriptContext->GetLibrary()->GetDefaultPropertyDescriptor();
        if (isAccessor)
        {
            newDescriptor.SetGetter(descriptor.GetterSpecified() ? descriptor.GetGetter() : defaultDescriptor->GetGetter());
            newDescriptor.SetSetter(descriptor.SetterSpecified() ? descriptor.GetSetter() : defaultDescriptor->GetSetter());
        }
        else
        {
            newDescriptor.SetValue(descriptor.ValueSpecified() ? descriptor.GetValue() : defaultDescriptor->GetValue());
            newDescriptor.SetWritable(descriptor.WritableSpecified() ? descriptor.IsWritable() : defaultDescriptor->IsWritable());
        }
        newDescriptor.SetConfigurable(descriptor.ConfigurableSpecified() ? descriptor.IsConfigurable() : defaultDescriptor->IsConfigurable());
        newDescriptor.SetEnumerable(descriptor.EnumerableSpecified() ? descriptor.IsEnumerable() : defaultDescriptor->IsEnumerable());
        return newDescriptor;
    }